

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psf_file.cpp
# Opt level: O2

void __thiscall PSFFile::PSFFile(PSFFile *this,string *filename)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  ulong uVar5;
  uint8_t version;
  uint32_t compressed_exe_size;
  uint32_t reserved_size;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  uint32_t compressed_exe_crc32;
  string tag_string;
  string tag_marker;
  string signature;
  string value;
  ostringstream message_buffer;
  string key;
  string tag_line;
  ifstream in;
  __ino_t local_268;
  ulong local_240;
  
  this->_vptr_PSFFile = (_func_int **)&PTR__PSFFile_0010dd20;
  (this->reserved_)._M_dataplus._M_p = (pointer)&(this->reserved_).field_2;
  (this->reserved_)._M_string_length = 0;
  (this->reserved_).field_2._M_local_buf[0] = '\0';
  (this->compressed_exe_)._M_dataplus._M_p = (pointer)&(this->compressed_exe_).field_2;
  (this->compressed_exe_)._M_string_length = 0;
  (this->compressed_exe_).field_2._M_local_buf[0] = '\0';
  (this->tags_)._M_h._M_buckets = &(this->tags_)._M_h._M_single_bucket;
  (this->tags_)._M_h._M_bucket_count = 1;
  (this->tags_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tags_)._M_h._M_element_count = 0;
  (this->tags_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tags_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tags_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  iVar2 = stat((filename->_M_dataplus)._M_p,(stat *)&in);
  if ((iVar2 != 0) || (local_240 == 0xffffffffffffffff)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&in);
    poVar3 = std::operator<<((ostream *)&in,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"File not exists.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&message_buffer);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(&in);
  std::ios::exceptions((int)&in + (int)*(undefined8 *)(_in - 0x18));
  std::ifstream::open((string *)&in,(_Ios_Openmode)filename);
  signature._M_dataplus._M_p = (pointer)&signature.field_2;
  std::__cxx11::string::_M_construct((ulong)&signature,'\x03');
  std::istream::read((char *)&in,(long)signature._M_dataplus._M_p);
  if (local_268 != 3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer);
    poVar3 = std::operator<<((ostream *)&message_buffer,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the PSF signature.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&tags);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator!=(&signature,"PSF");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer);
    poVar3 = std::operator<<((ostream *)&message_buffer,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid PSF signature. ");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&tags);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = ReadStreamAsInt8<std::ifstream,unsigned_char>(&in,&version);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer);
    poVar3 = std::operator<<((ostream *)&message_buffer,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the version byte.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&tags);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = ReadStreamAsInt32L<std::ifstream,unsigned_int>(&in,&reserved_size);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer);
    poVar3 = std::operator<<((ostream *)&message_buffer,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the size of reserved area.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&tags);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = ReadStreamAsInt32L<std::ifstream,unsigned_int>(&in,&compressed_exe_size);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer);
    poVar3 = std::operator<<((ostream *)&message_buffer,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the size of compressed program.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&tags);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = ReadStreamAsInt32L<std::ifstream,unsigned_int>(&in,&compressed_exe_crc32);
  if (bVar1) {
    uVar5 = (ulong)(reserved_size + compressed_exe_size + 0x10);
    if (local_240 < uVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer);
      poVar3 = std::operator<<((ostream *)&message_buffer,(string *)filename);
      poVar3 = std::operator<<(poVar3,": ");
      std::operator<<(poVar3,"File is too short than expected.");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&tags);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->version_ = version;
    std::__cxx11::string::resize((ulong)&this->reserved_);
    std::istream::read((char *)&in,(long)(this->reserved_)._M_dataplus._M_p);
    if (reserved_size == 3) {
      std::__cxx11::string::resize((ulong)&this->compressed_exe_);
      std::istream::read((char *)&in,(long)(this->compressed_exe_)._M_dataplus._M_p);
      if (compressed_exe_size == 3) {
        this->compressed_exe_crc32_ = compressed_exe_crc32;
        if (uVar5 + 5 <= local_240) {
          tag_marker._M_dataplus._M_p = (pointer)&tag_marker.field_2;
          std::__cxx11::string::_M_construct((ulong)&tag_marker,'\x05');
          std::istream::read((char *)&in,(long)tag_marker._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&tag_marker);
        }
        std::__cxx11::string::~string((string *)&signature);
        std::ifstream::~ifstream(&in);
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer);
      poVar3 = std::operator<<((ostream *)&message_buffer,(string *)filename);
      poVar3 = std::operator<<(poVar3,": ");
      std::operator<<(poVar3,"Unable to read the compressed program.");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&tags);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer);
    poVar3 = std::operator<<((ostream *)&message_buffer,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the reserved area.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&tags);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer);
  poVar3 = std::operator<<((ostream *)&message_buffer,(string *)filename);
  poVar3 = std::operator<<(poVar3,": ");
  std::operator<<(poVar3,"Unable to read the CRC32 of compressed program.");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)&tags);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PSFFile::PSFFile(const std::string & filename) {
  // get input file size
  off_t filesize = path_getfilesize(filename.c_str());
  if (filesize == -1) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "File not exists.";
    throw std::runtime_error(message_buffer.str());
  }
  std::uintmax_t psf_size = static_cast<std::uintmax_t>(filesize);

  // open input file
  std::ifstream in;
  in.exceptions(std::ios::badbit);
  in.open(filename, std::ios::binary);

  // check signature
  std::string signature(kPSFSignatureSize, 0);
  in.read(&signature[0], kPSFSignatureSize);
  if (in.gcount() != kPSFSignatureSize) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the PSF signature.";
    throw std::runtime_error(message_buffer.str());
  }
  if (signature != kPSFSignature) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Invalid PSF signature. ";
    throw std::runtime_error(message_buffer.str());
  }

  // read the version byte
  uint8_t version;
  if (!ReadStreamAsInt8(in, version)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the version byte.";
    throw std::runtime_error(message_buffer.str());
  }

  // read the size of reserved area
  uint32_t reserved_size;
  if (!ReadStreamAsInt32L(in, reserved_size)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the size of reserved area.";
    throw std::runtime_error(message_buffer.str());
  }

  // read the size of compressed program
  uint32_t compressed_exe_size;
  if (!ReadStreamAsInt32L(in, compressed_exe_size)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the size of compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // crc32 of compressed program
  uint32_t compressed_exe_crc32;
  if (!ReadStreamAsInt32L(in, compressed_exe_crc32)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the CRC32 of compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // check the size consistency
  size_t psf_mandatory_size = 0x10 + reserved_size + compressed_exe_size;
  if (psf_mandatory_size > psf_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "File is too short than expected.";
    throw std::runtime_error(message_buffer.str());
  }

  // set the version byte
  set_version(version);

  // read the reserved area
  reserved().resize(reserved_size);
  in.read(&reserved()[0], reserved_size);
  if (in.gcount() != reserved_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the reserved area.";
    throw std::runtime_error(message_buffer.str());
  }

  // read the compressed program
  compressed_exe().resize(compressed_exe_size);
  in.read(&compressed_exe()[0], compressed_exe_size);
  if (in.gcount() != compressed_exe_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // set the CRC32 of the compressed program
  set_compressed_exe_crc32(compressed_exe_crc32);

  // check the tag marker (optional area)
  if (psf_mandatory_size + kPSFTagMarkerSize <= psf_size) {
    std::string tag_marker(kPSFTagMarkerSize, 0);
    in.read(&tag_marker[0], kPSFTagMarkerSize);
    if (in.gcount() == kPSFTagMarkerSize && tag_marker == kPSFTagMarker) {
      // read entire of the tag area
      size_t tag_size = (size_t)psf_size - (0x10 + reserved_size + compressed_exe_size + kPSFTagMarkerSize);
      std::string tag_string(tag_size, 0);
      in.read(&tag_string[0], tag_size);
      if (in.gcount() != tag_size) {
        std::ostringstream message_buffer;
        message_buffer << filename << ": " << "Unable to read the tag area.";
        throw std::runtime_error(message_buffer.str());
      }

      // Parse tag section. Details are available here:
      // http://wiki.neillcorlett.com/PSFTagFormat
      std::unordered_map<std::string, std::string> tags;
      size_t tag_start_offset = 0;
      while (tag_start_offset < tag_string.size()) {
        // Search the end position of the current line.
        size_t tag_end_offset = tag_string.find("\n", tag_start_offset);
        if (tag_end_offset == std::string::npos) {
          // Tag section must end with a newline.
          // Read the all remaining bytes if a newline lacks though.
          tag_end_offset = tag_string.size();
        }

        // Search the variable=value separator.
        std::string tag_line = tag_string.substr(tag_start_offset, tag_end_offset - tag_start_offset);
        size_t tag_separator_offset = tag_line.find("=", 0);
        if (tag_separator_offset == std::string::npos) {
          // Blank lines, or lines not of the form "variable=value", are ignored.
          tag_start_offset = tag_end_offset + 1;
          continue;
        }
        tag_separator_offset += tag_start_offset;

        // Determine the start/end position of variable.
        size_t name_start_offset = tag_start_offset;
        size_t name_end_offset = tag_separator_offset;
        size_t value_start_offset = tag_separator_offset + 1;
        size_t value_end_offset = tag_end_offset;

        // Whitespace at the beginning/end of the line and before/after the = are ignored.
        // All characters 0x01-0x20 are considered whitespace.
        // (There must be no null (0x00) characters.)
        // Trim them.
        while (name_end_offset > name_start_offset && static_cast<unsigned char>(tag_string[name_end_offset - 1]) <= 0x20) {
          name_end_offset--;
        }
        while (value_end_offset > value_start_offset && static_cast<unsigned char>(tag_string[value_end_offset - 1]) <= 0x20) {
          value_end_offset--;
        }
        while (name_start_offset < name_end_offset && static_cast<unsigned char>(tag_string[name_start_offset]) <= 0x20) {
          name_start_offset++;
        }
        while (value_start_offset < value_end_offset && static_cast<unsigned char>(tag_string[value_start_offset]) <= 0x20) {
          value_start_offset++;
        }

        // Read variable=value as string.
        std::string key = tag_string.substr(name_start_offset, name_end_offset - name_start_offset);
        std::string value = tag_string.substr(value_start_offset, value_end_offset - value_start_offset);

        // Multiple-line variables must appear as consecutive lines using the same variable name.
        // For instance:
        //   comment=This is a
        //   comment=multiple-line
        //   comment=comment.
        // Therefore, check if the variable had already appeared.
        std::unordered_map<std::string, std::string>::iterator it = tags.find(key);
        if (it != tags.end() && it->first == key) {
          it->second += "\n";
          it->second += value;
        }
        else {
          tags.insert(it, std::make_pair(key, value));
        }

        // parse next line
        tag_start_offset = tag_end_offset + 1;
      }

      set_tags(std::move(tags));
    }
  }
}